

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_match_mode(args_t *this,char *str)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"id");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x1c) = 0;
  }
  else {
    iVar1 = strcmp(in_RSI,"id_sequence");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x1c) = 1;
    }
    else {
      iVar1 = strcmp(in_RSI,"sequence");
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDI + 0x1c) = 2;
      }
      else {
        ERROR("invalid match mode: %s",in_RSI);
      }
    }
  }
  return;
}

Assistant:

void args_t::parse_match_mode ( const char * str )
    {
        if (!strcmp (str, "id")) {
            checks = id;
        } else if (!strcmp (str, "id_sequence")) {
            checks = id_and_sequence;
        } else if (!strcmp (str, "sequence")) {
          checks = sequence;
        } else  {
            ERROR( "invalid match mode: %s", str );
        }
    }